

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::PackedStructType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  SourceRange range;
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  reference ppSVar4;
  size_type sVar5;
  reference ppFVar6;
  long in_RDX;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  Token TVar7;
  SourceRange SVar8;
  iterator iVar9;
  string_view sVar10;
  SourceRange SVar11;
  SourceRange SVar12;
  FieldSymbol *member_1;
  reverse_iterator<slang::ast::FieldSymbol_**> __end2_1;
  reverse_iterator<slang::ast::FieldSymbol_**> __begin2_1;
  reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>
  *__range2_1;
  bitwidth_t offset;
  Diagnostic *diag_2;
  SyntaxNode *in_stack_00000248;
  Scope *in_stack_00000250;
  Diagnostic *diag_1;
  Type *dimType;
  FieldSymbol *field;
  DeclaratorSyntax *decl;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range3;
  Diagnostic *diag;
  Type *type;
  StructUnionMemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *__range2;
  SmallVector<slang::ast::FieldSymbol_*,_5UL> members;
  ASTContext context;
  PackedStructType *structType;
  bool issuedError;
  bool isSigned;
  Type *in_stack_fffffffffffffbe8;
  ValueSymbol *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  bitwidth_t in_stack_fffffffffffffbfc;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffc00;
  SourceLocation in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  DiagCode in_stack_fffffffffffffc14;
  SourceLocation in_stack_fffffffffffffc18;
  Symbol *in_stack_fffffffffffffc20;
  SourceLocation in_stack_fffffffffffffc28;
  SourceLocation in_stack_fffffffffffffc30;
  Diagnostic *in_stack_fffffffffffffc38;
  Diagnostic *in_stack_fffffffffffffc40;
  Diagnostic *in_stack_fffffffffffffc48;
  reverse_iterator<slang::ast::FieldSymbol_**> local_248;
  undefined1 local_240 [8];
  reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>
  *local_238;
  undefined1 *local_230;
  uint local_224;
  SourceRange local_220;
  SourceLocation local_210;
  undefined4 local_204;
  Diagnostic *local_200;
  undefined4 local_1f4;
  SourceRange local_1f0;
  undefined4 local_1dc;
  SourceRange local_1d8;
  SourceRange local_1c8;
  undefined4 local_1b4;
  Diagnostic *local_1b0;
  Type *local_1a8;
  undefined4 local_190;
  undefined4 local_18c;
  SourceLocation local_188;
  string_view local_180;
  FieldSymbol *local_170;
  DeclaratorSyntax *local_168;
  iterator local_160;
  iterator local_150;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_140;
  SourceRange local_138;
  Token local_128;
  SourceLocation local_118;
  undefined4 local_10c;
  Diagnostic *local_108;
  Type *local_100;
  StructUnionMemberSyntax *local_e8;
  StructUnionMemberSyntax **local_e0;
  __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
  local_d8;
  SyntaxNode **local_d0;
  SmallVectorBase<slang::ast::FieldSymbol_*> local_c8 [2];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  SourceLocation local_38;
  PackedStructType *local_30;
  byte local_22;
  undefined1 local_21;
  long local_20;
  SyntaxNode *local_18;
  Compilation *local_10;
  Type *local_8;
  
  local_21 = (short)in_RSI[3].kind == LogicalEquivalenceExpression;
  local_22 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = parsing::Token::location((Token *)(in_RSI + 1));
  local_30 = BumpAllocator::
             emplace<slang::ast::PackedStructType,slang::ast::Compilation&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                       ((BumpAllocator *)
                        CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                        (Compilation *)in_stack_fffffffffffffc08,
                        (bool *)in_stack_fffffffffffffc00.m_bits,
                        (SourceLocation *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                        (ASTContext *)in_stack_fffffffffffffbf0);
  Symbol::setSyntax((Symbol *)local_30,local_18);
  local_80 = LookupLocation::max;
  local_78 = DAT_00de66d0;
  local_88 = *(undefined8 *)(local_20 + 0x10);
  lookupLocation.index = in_stack_fffffffffffffc10;
  lookupLocation.scope = (Scope *)in_stack_fffffffffffffc08;
  lookupLocation._12_2_ = in_stack_fffffffffffffc14.subsystem;
  lookupLocation._14_2_ = in_stack_fffffffffffffc14.code;
  ASTContext::ASTContext
            ((ASTContext *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (Scope *)in_stack_fffffffffffffbf0,lookupLocation,in_stack_fffffffffffffc00);
  SmallVector<slang::ast::FieldSymbol_*,_5UL>::SmallVector
            ((SmallVector<slang::ast::FieldSymbol_*,_5UL> *)0x4d2595);
  local_d0 = &local_18[4].parent;
  local_d8._M_current =
       (StructUnionMemberSyntax **)
       std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffbe8);
  local_e0 = (StructUnionMemberSyntax **)
             std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                        CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
  SVar12.endLoc = in_stack_fffffffffffffc28;
  SVar12.startLoc = in_stack_fffffffffffffc30;
  do {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffbf0,
                       (__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffbe8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (((local_30->super_IntegralType).bitWidth == 0) || ((local_22 & 1) != 0)) {
        local_8 = Compilation::getErrorType(local_10);
      }
      else {
        local_224 = 0;
        local_238 = std::ranges::views::_Reverse::
                    operator()<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_&>
                              ((_Reverse *)in_stack_fffffffffffffbf0,
                               (SmallVector<slang::ast::FieldSymbol_*,_5UL> *)
                               in_stack_fffffffffffffbe8);
        local_230 = local_240;
        std::ranges::
        reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>::
        begin((reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>
               *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        std::ranges::
        reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>::
        end((reverse_view<std::ranges::ref_view<slang::SmallVector<slang::ast::FieldSymbol_*,_5UL>_>_>
             *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
        while( true ) {
          bVar1 = std::operator==<slang::ast::FieldSymbol_**>
                            ((reverse_iterator<slang::ast::FieldSymbol_**> *)
                             in_stack_fffffffffffffbf0,
                             (reverse_iterator<slang::ast::FieldSymbol_**> *)
                             in_stack_fffffffffffffbe8);
          if (((bVar1 ^ 0xffU) & 1) == 0) break;
          ppFVar6 = std::reverse_iterator<slang::ast::FieldSymbol_**>::operator*(&local_248);
          (*ppFVar6)->bitOffset = (ulong)local_224;
          ValueSymbol::getType((ValueSymbol *)0x4d3075);
          in_stack_fffffffffffffbfc =
               Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffbfc,
                                                  in_stack_fffffffffffffbf8));
          local_224 = in_stack_fffffffffffffbfc + local_224;
          std::reverse_iterator<slang::ast::FieldSymbol_**>::operator++(&local_248);
        }
        local_8 = anon_unknown.dwarf_7e7db8::createPackedDims
                            ((ASTContext *)SVar12.startLoc,(Type *)SVar12.endLoc,
                             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                             in_stack_fffffffffffffc20);
      }
LAB_004d30f5:
      local_1f4 = 1;
      SmallVector<slang::ast::FieldSymbol_*,_5UL>::~SmallVector
                ((SmallVector<slang::ast::FieldSymbol_*,_5UL> *)0x4d3102);
      return local_8;
    }
    ppSVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_d8);
    local_e8 = *ppSVar4;
    if ((local_e8->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_00000250,in_stack_00000248);
    }
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4d268a);
    local_100 = Compilation::getType
                          ((Compilation *)in_stack_fffffffffffffc00.m_bits,
                           (DataTypeSyntax *)
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           (ASTContext *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    bVar1 = Type::isFourState((Type *)in_stack_fffffffffffffc48);
    (local_30->super_IntegralType).isFourState =
         (bool)((local_30->super_IntegralType).isFourState & 1U | bVar1);
    bVar2 = Type::isError((Type *)0x4d270c);
    bVar1 = (local_22 & 1) != 0;
    local_22 = bVar1 || bVar2;
    if (!bVar1 && !bVar2) {
      bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffbf0);
      if (!bVar1) {
        local_22 = 1;
        local_10c = 0x1c0009;
        not_null<slang::syntax::DataTypeSyntax_*>::operator->
                  ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4d2797);
        TVar7 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffc20);
        local_128 = TVar7;
        local_118 = parsing::Token::location(&local_128);
        local_108 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc00.m_bits,
                                        in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
        ast::operator<<(in_stack_fffffffffffffc40,(Type *)in_stack_fffffffffffffc38);
        not_null<slang::syntax::DataTypeSyntax_*>::operator->
                  ((not_null<slang::syntax::DataTypeSyntax_*> *)0x4d2875);
        SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40);
        SVar11.startLoc._4_4_ = in_stack_fffffffffffffbfc;
        SVar11.startLoc._0_4_ = in_stack_fffffffffffffbf8;
        SVar11.endLoc = (SourceLocation)in_stack_fffffffffffffc00.m_bits;
        local_138 = SVar8;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffbf0,SVar11);
      }
    }
    local_140 = &local_e8->declarators;
    iVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x4d2900);
    local_150 = iVar9;
    iVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
                       in_stack_fffffffffffffbf0);
    local_160 = iVar9;
    while( true ) {
      bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffbf0,
                         (iterator_base<slang::syntax::DeclaratorSyntax_*> *)
                         in_stack_fffffffffffffbe8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_168 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                               *)0x4d29ae);
      sVar10 = parsing::Token::valueText((Token *)in_stack_fffffffffffffc00.m_bits);
      local_180 = sVar10;
      local_188 = parsing::Token::location(&local_168->name);
      local_18c = 0;
      sVar5 = SmallVectorBase<slang::ast::FieldSymbol_*>::size(local_c8);
      local_190 = (undefined4)sVar5;
      local_170 = BumpAllocator::
                  emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                            ((BumpAllocator *)in_stack_fffffffffffffc20,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffc18,
                             (SourceLocation *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                             (uint *)in_stack_fffffffffffffc08,
                             (uint *)in_stack_fffffffffffffc00.m_bits);
      ValueSymbol::setType(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
      Symbol::setSyntax((Symbol *)local_170,&local_168->super_SyntaxNode);
      not_null<const_slang::ast::Scope_*>::operator*
                ((not_null<const_slang::ast::Scope_*> *)0x4d2af7);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffc00.m_bits,
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8));
      syntax_00._M_extent._M_extent_value = (size_t)SVar12.startLoc;
      syntax_00._M_ptr = (pointer)SVar12.endLoc;
      Symbol::setAttributes(in_stack_fffffffffffffc20,(Scope *)in_stack_fffffffffffffc18,syntax_00);
      Scope::addMember((Scope *)in_stack_fffffffffffffbf0,&in_stack_fffffffffffffbe8->super_Symbol);
      SmallVectorBase<slang::ast::FieldSymbol_*>::push_back
                ((SmallVectorBase<slang::ast::FieldSymbol_*> *)in_stack_fffffffffffffbf0,
                 (FieldSymbol **)in_stack_fffffffffffffbe8);
      local_1a8 = Compilation::getType
                            ((Compilation *)in_stack_fffffffffffffc00.m_bits,
                             (Type *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                             in_stack_fffffffffffffbf0,(ASTContext *)in_stack_fffffffffffffbe8);
      bVar1 = Type::isUnpackedArray(in_stack_fffffffffffffbe8);
      if ((bVar1) && ((local_22 & 1) == 0)) {
        local_1b4 = 0x1c0009;
        SVar11 = parsing::Token::range
                           ((Token *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        sourceRange.startLoc._4_2_ = in_stack_fffffffffffffc14.subsystem;
        sourceRange.startLoc._6_2_ = in_stack_fffffffffffffc14.code;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffffc10;
        sourceRange.endLoc = in_stack_fffffffffffffc18;
        local_1c8 = SVar11;
        local_1b0 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc08,
                                        SUB84((ulong)in_stack_fffffffffffffc20 >> 0x20,0),
                                        sourceRange);
        ast::operator<<(in_stack_fffffffffffffc40,(Type *)in_stack_fffffffffffffc38);
        SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40);
        SVar8.startLoc._4_4_ = in_stack_fffffffffffffbfc;
        SVar8.startLoc._0_4_ = in_stack_fffffffffffffbf8;
        SVar8.endLoc = (SourceLocation)in_stack_fffffffffffffc00.m_bits;
        local_1d8 = SVar11;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffbf0,SVar8);
        local_22 = 1;
      }
      bVar3 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8
                                                ));
      (local_30->super_IntegralType).bitWidth = bVar3 + (local_30->super_IntegralType).bitWidth;
      if (((local_22 & 1) == 0) && (0xffffff < (local_30->super_IntegralType).bitWidth)) {
        local_1dc = 0x1d0009;
        local_1f0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40);
        sourceRange_00.startLoc._4_2_ = in_stack_fffffffffffffc14.subsystem;
        sourceRange_00.startLoc._6_2_ = in_stack_fffffffffffffc14.code;
        sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffc10;
        sourceRange_00.endLoc = in_stack_fffffffffffffc18;
        ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc08,
                            SUB84((ulong)in_stack_fffffffffffffc20 >> 0x20,0),sourceRange_00);
        Diagnostic::operator<<<unsigned_int>
                  ((Diagnostic *)in_stack_fffffffffffffc00.m_bits,in_stack_fffffffffffffbfc);
        Diagnostic::operator<<<unsigned_int>
                  ((Diagnostic *)in_stack_fffffffffffffc00.m_bits,in_stack_fffffffffffffbfc);
        local_8 = Compilation::getErrorType(local_10);
        goto LAB_004d30f5;
      }
      if (local_168->initializer != (EqualsValueClauseSyntax *)0x0) {
        local_204 = 0x1b0009;
        local_210 = parsing::Token::location(&local_168->initializer->equals);
        in_stack_fffffffffffffc38 =
             ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffc00.m_bits,
                                 in_stack_fffffffffffffc14,in_stack_fffffffffffffc08);
        in_stack_fffffffffffffc48 = in_stack_fffffffffffffc38;
        local_200 = in_stack_fffffffffffffc38;
        in_stack_fffffffffffffc40 =
             (Diagnostic *)
             not_null<slang::syntax::ExpressionSyntax_*>::operator->
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x4d2ec7);
        SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffffc40);
        range.startLoc._4_4_ = in_stack_fffffffffffffbfc;
        range.startLoc._0_4_ = in_stack_fffffffffffffbf8;
        range.endLoc = (SourceLocation)in_stack_fffffffffffffc00.m_bits;
        local_220 = SVar12;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffbf0,range);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                  *)in_stack_fffffffffffffbf0);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_d8);
  } while( true );
}

Assistant:

const Type& PackedStructType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                         const ASTContext& parentContext) {
    SLANG_ASSERT(syntax.packed);
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    bool issuedError = false;

    auto structType = comp.emplace<PackedStructType>(comp, isSigned, syntax.keyword.location(),
                                                     parentContext);
    structType->setSyntax(syntax);

    ASTContext context(*structType, LookupLocation::max, parentContext.flags);

    SmallVector<FieldSymbol*> members;
    for (auto member : syntax.members) {
        if (member->previewNode)
            structType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        structType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral()) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto field = comp.emplace<FieldSymbol>(decl->name.valueText(), decl->name.location(),
                                                   0u, (uint32_t)members.size());
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            structType->addMember(*field);
            members.push_back(field);

            // Unpacked arrays are disallowed in packed structs.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            structType->bitWidth += type.getBitWidth();
            if (!issuedError && structType->bitWidth > (uint32_t)SVInt::MAX_BITS) {
                context.addDiag(diag::PackedTypeTooLarge, syntax.sourceRange())
                    << structType->bitWidth << (uint32_t)SVInt::MAX_BITS;
                return comp.getErrorType();
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    if (!structType->bitWidth || issuedError)
        return comp.getErrorType();

    // We added the fields in reverse order, so compute their actual
    // offsets in the right order now.
    bitwidth_t offset = 0;
    for (auto member : std::views::reverse(members)) {
        member->bitOffset = offset;
        offset += member->getType().getBitWidth();
    }

    return createPackedDims(parentContext, structType, syntax.dimensions);
}